

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O0

void ProcessEDLinedef(line_t_conflict *ld,int recordnum)

{
  EDLinedef *pEVar1;
  DWORD fmask;
  EDLinedef *eld;
  int recordnum_local;
  line_t_conflict *ld_local;
  
  InitED();
  pEVar1 = TMap<int,_EDLinedef,_THashTraits<int>,_TValueTraits<EDLinedef>_>::CheckKey
                     (&EDLines,recordnum);
  if (pEVar1 == (EDLinedef *)0x0) {
    Printf("EDF Linedef record %d not found\n",(ulong)(uint)recordnum);
    ld->special = 0;
  }
  else {
    ld->special = pEVar1->special;
    ld->activation = pEVar1->activation;
    ld->flags = ld->flags & 0xff7679ff | pEVar1->flags;
    line_t::setAlpha((line_t *)ld,pEVar1->alpha);
    *(undefined8 *)ld->args = *(undefined8 *)pEVar1->args;
    *(undefined8 *)(ld->args + 2) = *(undefined8 *)(pEVar1->args + 2);
    ld->args[4] = pEVar1->args[4];
    FTagManager::AddLineID(&tagManager,(int)(((long)ld - (long)lines) / 0x98),pEVar1->tag);
  }
  return;
}

Assistant:

void ProcessEDLinedef(line_t *ld, int recordnum)
{
	InitED();

	EDLinedef *eld = EDLines.CheckKey(recordnum);
	if (eld == NULL)
	{
		Printf("EDF Linedef record %d not found\n", recordnum);
		ld->special = 0;
		return;
	}
	const DWORD fmask = ML_REPEAT_SPECIAL | ML_FIRSTSIDEONLY | ML_ADDTRANS | ML_BLOCKEVERYTHING | ML_ZONEBOUNDARY | ML_CLIP_MIDTEX;
	ld->special = eld->special;
	ld->activation = eld->activation;
	ld->flags = (ld->flags&~fmask) | eld->flags;
	ld->setAlpha(eld->alpha);
	memcpy(ld->args, eld->args, sizeof(ld->args));
	tagManager.AddLineID(int(ld - lines), eld->tag);
}